

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O2

int __thiscall
Signal<std::shared_ptr<Reaction>_>::Connect
          (Signal<std::shared_ptr<Reaction>_> *this,function<void_(std::shared_ptr<Reaction>)> *slot
          )

{
  pair<int,_std::function<void_(std::shared_ptr<Reaction>)>_> local_40;
  
  this->current_id_ = this->current_id_ + 1;
  std::pair<int,_std::function<void_(std::shared_ptr<Reaction>)>_>::pair<int_&,_true>
            (&local_40,&this->current_id_,slot);
  std::
  _Rb_tree<int,std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>,std::_Select1st<std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>>,std::less<int>,std::allocator<std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>>>
  ::_M_emplace_unique<std::pair<int,std::function<void(std::shared_ptr<Reaction>)>>>
            ((_Rb_tree<int,std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>,std::_Select1st<std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>>,std::less<int>,std::allocator<std::pair<int_const,std::function<void(std::shared_ptr<Reaction>)>>>>
              *)this,&local_40);
  std::_Function_base::~_Function_base(&local_40.second.super__Function_base);
  return this->current_id_;
}

Assistant:

int Connect(std::function<void(Args...)> const &slot) const {
    slots_.insert(std::make_pair(++current_id_, slot));
    return current_id_;
  }